

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypes.h
# Opt level: O0

bool __thiscall Diligent::Box::operator==(Box *this,Box *Rhs)

{
  bool local_19;
  Box *Rhs_local;
  Box *this_local;
  
  local_19 = false;
  if ((((this->MinX == Rhs->MinX) && (local_19 = false, this->MaxX == Rhs->MaxX)) &&
      (local_19 = false, this->MinY == Rhs->MinY)) &&
     ((local_19 = false, this->MaxY == Rhs->MaxY && (local_19 = false, this->MinZ == Rhs->MinZ)))) {
    local_19 = this->MaxZ == Rhs->MaxZ;
  }
  return local_19;
}

Assistant:

constexpr bool operator==(const Box &Rhs) const
    {
        return MinX == Rhs.MinX && MaxX == Rhs.MaxX &&
               MinY == Rhs.MinY && MaxY == Rhs.MaxY &&
               MinZ == Rhs.MinZ && MaxZ == Rhs.MaxZ;
    }